

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_bcast_qtree_single
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,void *src,void *dst,bsc_size_t size,
          bsc_pid_t q)

{
  long lVar1;
  bsp_pid_t bVar2;
  int iVar3;
  bsp_pid_t bVar4;
  request_t *prVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bsc_step_t local_5c;
  int local_50;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar8 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    root = *(int *)(lVar1 + (long)root * 4);
    bVar2 = bsp_pid();
    iVar8 = *(int *)(lVar1 + (long)bVar2 * 4);
  }
  local_50 = ((iVar3 - root) + iVar8) % iVar3;
  if ((dst != src) && (local_50 == 0)) {
    memcpy(dst,src,(long)size);
  }
  local_5c = depends;
  if (1 < iVar3) {
    iVar8 = 1;
    do {
      iVar7 = q + -1;
      iVar6 = local_50;
      if (local_50 < iVar8 && 1 < q) {
        do {
          iVar6 = iVar6 + iVar8;
          if (iVar6 < iVar3) {
            bVar2 = (iVar6 + root) % iVar3;
            if (group != (bsc_group_t)0x0) {
              bVar2 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + (long)bVar2 * 4);
            }
            bVar4 = bsp_pid();
            prVar5 = new_request(local_5c);
            prVar5->kind = PUT;
            (prVar5->payload).put.src_addr = dst;
            (prVar5->payload).put.dst_addr = dst;
            (prVar5->payload).put.src_pid = bVar4;
            (prVar5->payload).put.dst_pid = bVar2;
            (prVar5->payload).put.size = size;
            (prVar5->payload).put.offset = 0;
          }
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      local_5c = local_5c + 1;
      iVar8 = iVar8 * q;
    } while (iVar8 < iVar3);
  }
  return local_5c;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_qtree_single( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      const void * src, void * dst, bsc_size_t size,
                      bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;

    if ( me == 0 && dst != src ) 
        memcpy( dst, src, size ); 

    for (range = 1; range < P; range *= q ) {
        if ( me < range ) {
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = ( j + r ) % P;
                    bsc_put( depends, g?g->gid[j]:j, dst, dst, 0, size );
                }
            }
        }
        depends += 1;
    }
    return depends;
}